

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrologEncoderMD.cpp
# Opt level: O3

size_t PrologEncoderMD::GetAllocaSize(Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  Opnd *pOVar5;
  
  if (instr->m_opcode != SUB) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x66,"(instr->m_opcode == Js::OpCode::SUB)",
                       "instr->m_opcode == Js::OpCode::SUB");
    if (!bVar2) goto LAB_0064cb48;
    *puVar4 = 0;
  }
  pOVar5 = instr->m_src1;
  if ((pOVar5 == (Opnd *)0x0) || (instr->m_src2 == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x67,"(instr->GetSrc1() && instr->GetSrc2())",
                       "instr->GetSrc1() && instr->GetSrc2()");
    if (!bVar2) goto LAB_0064cb48;
    *puVar4 = 0;
    pOVar5 = instr->m_src1;
  }
  OVar3 = IR::Opnd::GetKind(pOVar5);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar2) goto LAB_0064cb48;
    *puVar4 = 0;
  }
  if (*(byte *)((long)&pOVar5[1].m_valueType.field_0.bits + 1) == 5) {
    OVar3 = IR::Opnd::GetKind(instr->m_src2);
    if (OVar3 != OpndKindIntConst) goto LAB_0064c9c6;
  }
  else {
LAB_0064c9c6:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x69,
                       "(instr->GetSrc1()->AsRegOpnd()->GetReg() == RegRSP && instr->GetSrc2()->IsIntConstOpnd())"
                       ,
                       "instr->GetSrc1()->AsRegOpnd()->GetReg() == RegRSP && instr->GetSrc2()->IsIntConstOpnd()"
                      );
    if (!bVar2) goto LAB_0064cb48;
    *puVar4 = 0;
  }
  pOVar5 = instr->m_src2;
  OVar3 = IR::Opnd::GetKind(pOVar5);
  if (OVar3 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar2) goto LAB_0064cb48;
    *puVar4 = 0;
  }
  if (((ulong)pOVar5[1]._vptr_Opnd & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x6a,"(instr->GetSrc2()->AsIntConstOpnd()->GetValue() % 8 == 0)",
                       "instr->GetSrc2()->AsIntConstOpnd()->GetValue() % 8 == 0");
    if (!bVar2) goto LAB_0064cb48;
    *puVar4 = 0;
  }
  pOVar5 = instr->m_src2;
  OVar3 = IR::Opnd::GetKind(pOVar5);
  if (OVar3 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar2) {
LAB_0064cb48:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return (size_t)pOVar5[1]._vptr_Opnd;
}

Assistant:

size_t PrologEncoderMD::GetAllocaSize(IR::Instr *instr)
{
    Assert(instr->m_opcode == Js::OpCode::SUB);
    Assert(instr->GetSrc1() && instr->GetSrc2());
    Assert(instr->GetSrc1()->AsRegOpnd()->GetReg() == RegRSP &&
           instr->GetSrc2()->IsIntConstOpnd());
    Assert(instr->GetSrc2()->AsIntConstOpnd()->GetValue() % 8 == 0);

    return instr->GetSrc2()->AsIntConstOpnd()->GetValue();
}